

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::Copy<Diligent::PipelineResourceAttribsGL>
          (Serializer<(Diligent::SerializerMode)0> *this,PipelineResourceAttribsGL *pData,
          size_t Size)

{
  TPointer puVar1;
  TPointer puVar2;
  char (*in_R8) [7];
  string msg;
  size_t local_48;
  string local_40;
  
  puVar2 = this->m_End;
  puVar1 = this->m_Ptr + Size;
  local_48 = Size;
  if (puVar2 < puVar1) {
    FormatString<char[26],unsigned_long,char[7]>
              (&local_40,(Diligent *)"Note enough data to read ",(char (*) [26])&local_48,
               (unsigned_long *)0x7e846e,in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"Copy",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x149);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    memcpy(pData,this->m_Ptr,Size);
    this->m_Ptr = this->m_Ptr + Size;
  }
  return puVar1 <= puVar2;
}

Assistant:

bool Serializer<SerializerMode::Read>::Copy(T* pData, size_t Size)
{
    static_assert(IsAlignedBaseClass<T>::Value, "There is unused space at the end of the structure that may be filled with garbage. Use padding to zero-initialize this space and avoid nasty issues.");
    CHECK_REMAINING_SIZE(Size, "Note enough data to read ", Size, " bytes");
    std::memcpy(pData, m_Ptr, Size);
    m_Ptr += Size;
    return true;
}